

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::function_is_control_dependent(Compiler *this,SPIRFunction *func)

{
  TypedID<(spirv_cross::Types)6> *pTVar1;
  long lVar2;
  bool bVar3;
  SPIRBlock *block;
  long lVar4;
  long lVar5;
  
  pTVar1 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
  lVar5 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size
          << 2;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar5 == lVar4) break;
    block = get<spirv_cross::SPIRBlock>(this,*(uint32_t *)((long)&pTVar1->id + lVar4));
    bVar3 = block_is_control_dependent(this,block);
    lVar2 = lVar4 + 4;
  } while (!bVar3);
  return lVar5 != lVar4;
}

Assistant:

bool Compiler::function_is_control_dependent(const SPIRFunction &func)
{
	for (auto block : func.blocks)
		if (block_is_control_dependent(get<SPIRBlock>(block)))
			return true;

	return false;
}